

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_target.cpp
# Opt level: O3

bool __thiscall RenderTarget::save_image(RenderTarget *this,string *file)

{
  uint8_t uVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  int iVar7;
  Color24 *c;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  pointer pCVar11;
  ulong uVar12;
  vector<Color24,_std::allocator<Color24>_> img;
  string file_ext;
  undefined2 local_54;
  uint8_t local_52;
  vector<Color24,_std::allocator<Color24>_> local_50;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::string::rfind((char *)file,0x10a350,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_38,(ulong)file);
  iVar4 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar4 == 0) {
    std::vector<Color24,_std::allocator<Color24>_>::vector
              (&local_50,(ulong)(this->height * this->width),(allocator_type *)&local_54);
    get_colorbuf(this,&local_50);
    bVar3 = save_ppm(this,file,
                     &(local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                       super__Vector_impl_data._M_start)->r);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unsupported output image format: ",0x21);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_38,local_30);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      bVar3 = false;
      goto LAB_0010715a;
    }
    std::vector<Color24,_std::allocator<Color24>_>::vector
              (&local_50,(ulong)(this->height * this->width),(allocator_type *)&local_54);
    get_colorbuf(this,&local_50);
    uVar9 = this->height;
    pCVar2 = local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < uVar9) {
      uVar8 = (ulong)this->width;
      iVar4 = -1;
      uVar5 = 0;
      do {
        iVar7 = (int)uVar8;
        if (iVar7 == 0) {
          uVar8 = 0;
        }
        else {
          uVar10 = iVar7 * uVar5;
          uVar12 = 0;
          uVar9 = (uVar9 + iVar4) * iVar7;
          pCVar11 = local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            local_52 = pCVar11[uVar10].b;
            uVar12 = uVar12 + 1;
            local_54._0_1_ = pCVar11[uVar10].r;
            local_54._1_1_ = pCVar11[uVar10].g;
            pCVar11[uVar10].b = pCVar11[uVar9].b;
            uVar1 = pCVar11[uVar9].g;
            pCVar11[uVar10].r = pCVar11[uVar9].r;
            pCVar11[uVar10].g = uVar1;
            pCVar11[uVar9].b = local_52;
            pCVar11[uVar9].r = (undefined1)local_54;
            pCVar11[uVar9].g = local_54._1_1_;
            pCVar11 = pCVar11 + 1;
            uVar8 = (ulong)this->width;
          } while (uVar12 < uVar8);
          uVar9 = this->height;
        }
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + -1;
      } while (uVar5 < uVar9 >> 1);
    }
    for (; pCVar2 != local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                     super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
      uVar1 = pCVar2->r;
      pCVar2->r = pCVar2->b;
      pCVar2->b = uVar1;
    }
    bVar3 = save_bmp(this,file,
                     &(local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                       super__Vector_impl_data._M_start)->r);
  }
  if (local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0010715a:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return bVar3;
}

Assistant:

bool RenderTarget::save_image(const std::string &file) const {
	// Compute the correct image from the saved pixel data and write
	// it to the desired file
	std::string file_ext = file.substr(file.rfind(".") + 1);
	if (file_ext == "ppm"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		return save_ppm(file, &img[0].r);
	}
	if (file_ext == "bmp"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		//Do y-flip for BMP since BMP starts at the bottom-left
		for (uint32_t y = 0; y < height / 2; ++y){
			Color24 *a = &img[y * width];
			Color24 *b = &img[(height - y - 1) * width];
			for (uint32_t x = 0; x < width; ++x){
				std::swap(a[x], b[x]);
			}
		}
		// We also need to convert to BGRA order for BMP
		for (auto &c : img){
			std::swap(c.r, c.b);
		}
		return save_bmp(file, &img[0].r);
	}
	std::cout << "Unsupported output image format: " << file_ext << std::endl;
	return false;
}